

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameColumnElistNames(Parse *pParse,RenameCtx *pCtx,ExprList *pEList,char *zOld)

{
  char *zLeft;
  int iVar1;
  char **ppcVar2;
  long lVar3;
  
  if (pEList != (ExprList *)0x0) {
    ppcVar2 = &pEList->a[0].zName;
    for (lVar3 = 0; lVar3 < pEList->nExpr; lVar3 = lVar3 + 1) {
      zLeft = *ppcVar2;
      iVar1 = sqlite3_stricmp(zLeft,zOld);
      if (iVar1 == 0) {
        renameTokenFind(pParse,pCtx,zLeft);
      }
      ppcVar2 = ppcVar2 + 4;
    }
  }
  return;
}

Assistant:

static void renameColumnElistNames(
  Parse *pParse, 
  RenameCtx *pCtx, 
  ExprList *pEList, 
  const char *zOld
){
  if( pEList ){
    int i;
    for(i=0; i<pEList->nExpr; i++){
      char *zName = pEList->a[i].zName;
      if( 0==sqlite3_stricmp(zName, zOld) ){
        renameTokenFind(pParse, pCtx, (void*)zName);
      }
    }
  }
}